

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_timer.c
# Opt level: O0

void skynet_updatetime(void)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  uint local_1c;
  int i;
  uint32_t oc;
  uint32_t diff;
  uint64_t cp;
  
  uVar3 = gettime();
  if (uVar3 < TI->current_point) {
    skynet_error((skynet_context *)0x0,"time diff error: change from %lld to %lld",uVar3,
                 TI->current_point);
    TI->current_point = uVar3;
  }
  else if (uVar3 != TI->current_point) {
    uVar2 = (int)uVar3 - (int)TI->current_point;
    TI->current_point = uVar3;
    uVar1 = TI->current;
    TI->current = uVar2 + TI->current;
    if (TI->current < uVar1) {
      TI->starttime = TI->starttime + 0x28f5c28;
    }
    for (local_1c = 0; local_1c < uVar2; local_1c = local_1c + 1) {
      timer_update(TI);
    }
  }
  return;
}

Assistant:

void
skynet_updatetime(void) {
	uint64_t cp = gettime();
	if(cp < TI->current_point) {
		skynet_error(NULL, "time diff error: change from %lld to %lld", cp, TI->current_point);
		TI->current_point = cp;
	} else if (cp != TI->current_point) {
		uint32_t diff = (uint32_t)(cp - TI->current_point);
		TI->current_point = cp;

		uint32_t oc = TI->current;
		TI->current += diff;
		if (TI->current < oc) {
			// when cs > 0xffffffff(about 497 days), time rewind
			TI->starttime += 0xffffffff / 100;
		}
		int i;
		for (i=0;i<diff;i++) {
			timer_update(TI);
		}
	}
}